

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationSettings::copyReorderingFrom
          (CollationSettings *this,CollationSettings *other,UErrorCode *errorCode)

{
  uint8_t *table;
  int32_t iVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  table = other->reorderTable;
  if (table == (uint8_t *)0x0) {
    this->reorderTable = (uint8_t *)0x0;
    iVar1 = 0;
    this->minHighNoReorder = 0;
    this->reorderRangesLength = 0;
  }
  else {
    this->minHighNoReorder = other->minHighNoReorder;
    if (other->reorderCodesCapacity != 0) {
      setReorderArrays(this,other->reorderCodes,other->reorderCodesLength,other->reorderRanges,
                       other->reorderRangesLength,table,errorCode);
      return;
    }
    this->reorderTable = table;
    this->reorderRanges = other->reorderRanges;
    this->reorderRangesLength = other->reorderRangesLength;
    this->reorderCodes = other->reorderCodes;
    iVar1 = other->reorderCodesLength;
  }
  this->reorderCodesLength = iVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }